

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_store.cc
# Opt level: O3

string * rcg::ensureNewFileName(string *__return_storage_ptr__,string *name)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  undefined8 uVar3;
  char cVar4;
  long lVar5;
  ostream *poVar6;
  int iVar7;
  string suffix;
  ostringstream s;
  ifstream file;
  char *local_3f0;
  long local_3e8;
  char local_3e0 [16];
  undefined1 *local_3d0 [2];
  undefined1 local_3c0 [16];
  undefined1 *local_3b0 [2];
  undefined1 local_3a0 [96];
  ios_base local_340 [264];
  string local_238 [520];
  
  std::ifstream::ifstream(local_238,(string *)name,_S_in);
  cVar4 = std::__basic_file<char>::is_open();
  if (cVar4 != '\0') {
    std::ifstream::close();
    local_3f0 = local_3e0;
    local_3e8 = 0;
    local_3e0[0] = '\0';
    lVar5 = std::__cxx11::string::rfind((char)name,0x2e);
    if ((lVar5 != -1) && (name->_M_string_length - lVar5 < 5)) {
      std::__cxx11::string::substr((ulong)local_3b0,(ulong)name);
      std::__cxx11::string::operator=((string *)&local_3f0,(string *)local_3b0);
      if (local_3b0[0] != local_3a0) {
        operator_delete(local_3b0[0]);
      }
      std::__cxx11::string::substr((ulong)local_3b0,(ulong)name);
      std::__cxx11::string::operator=((string *)name,(string *)local_3b0);
      if (local_3b0[0] != local_3a0) {
        operator_delete(local_3b0[0]);
      }
    }
    iVar7 = 1;
    do {
      if (99 < iVar7) break;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b0);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_3b0,(name->_M_dataplus)._M_p,name->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"_",1);
      poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,iVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_3f0,local_3e8);
      std::__cxx11::stringbuf::str();
      std::ifstream::open(local_238,(_Ios_Openmode)(string *)local_3d0);
      if (local_3d0[0] != local_3c0) {
        operator_delete(local_3d0[0]);
      }
      cVar4 = std::__basic_file<char>::is_open();
      if (cVar4 == '\0') {
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::operator=((string *)name,(string *)local_3d0);
        if (local_3d0[0] != local_3c0) {
          operator_delete(local_3d0[0]);
        }
      }
      else {
        std::ifstream::close();
        iVar7 = iVar7 + 1;
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b0);
      std::ios_base::~ios_base(local_340);
    } while (cVar4 != '\0');
    if (local_3f0 != local_3e0) {
      operator_delete(local_3f0);
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar2 = (name->_M_dataplus)._M_p;
  paVar1 = &name->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar1) {
    uVar3 = *(undefined8 *)((long)&name->field_2 + 8);
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar3;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = pcVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  __return_storage_ptr__->_M_string_length = name->_M_string_length;
  (name->_M_dataplus)._M_p = (pointer)paVar1;
  name->_M_string_length = 0;
  (name->field_2)._M_local_buf[0] = '\0';
  std::ifstream::~ifstream(local_238);
  return __return_storage_ptr__;
}

Assistant:

std::string ensureNewFileName(std::string name)
{
  // check if given name is already used

  std::ifstream file(name);

  if (file.is_open())
  {
    file.close();

    // split name in prefix and suffix

    std::string suffix;

    size_t i=name.rfind('.');
    if (i != name.npos && name.size()-i <= 4)
    {
      suffix=name.substr(i);
      name=name.substr(0, i);
    }

    // add number for finding name that is nor used

    int n=1;
    while (n < 100)
    {
      std::ostringstream s;
      s << name << "_" << n << suffix;

      file.open(s.str());
      if (!file.is_open())
      {
        name=s.str();
        break;
      }

      file.close();
      n++;
    }
  }

  return name;
}